

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

string * __thiscall re2::Prog::Inst::Dump_abi_cxx11_(Inst *this)

{
  byte bVar1;
  byte bVar2;
  InstOp IVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  Inst *in_RSI;
  string *in_RDI;
  
  IVar3 = opcode(in_RSI);
  switch(IVar3) {
  case kInstAlt:
    uVar6 = out(in_RSI);
    StringPrintf_abi_cxx11_
              ((char *)in_RDI,"alt -> %d | %d",(ulong)uVar6,(ulong)(in_RSI->field_1).out1_);
    break;
  case kInstAltMatch:
    uVar6 = out(in_RSI);
    StringPrintf_abi_cxx11_
              ((char *)in_RDI,"altmatch -> %d | %d",(ulong)uVar6,(ulong)(in_RSI->field_1).out1_);
    break;
  case kInstByteRange:
    iVar4 = foldcase(in_RSI);
    pcVar7 = anon_var_dwarf_29dbec + 0x11;
    if (iVar4 != 0) {
      pcVar7 = "/i";
    }
    bVar1 = (in_RSI->field_1).field_3.lo_;
    bVar2 = (in_RSI->field_1).field_3.hi_;
    uVar6 = hint(in_RSI);
    iVar4 = out(in_RSI);
    StringPrintf_abi_cxx11_
              ((char *)in_RDI,"byte%s [%02x-%02x] %d -> %d",pcVar7,(ulong)bVar1,(ulong)bVar2,
               (ulong)uVar6,iVar4);
    break;
  case kInstCapture:
    uVar6 = (in_RSI->field_1).out1_;
    uVar5 = out(in_RSI);
    StringPrintf_abi_cxx11_((char *)in_RDI,"capture %d -> %d",(ulong)uVar6,(ulong)uVar5);
    break;
  case kInstEmptyWidth:
    uVar6 = (in_RSI->field_1).out1_;
    uVar5 = out(in_RSI);
    StringPrintf_abi_cxx11_((char *)in_RDI,"emptywidth %#x -> %d",(ulong)uVar6,(ulong)uVar5);
    break;
  case kInstMatch:
    uVar6 = match_id(in_RSI);
    StringPrintf_abi_cxx11_((char *)in_RDI,"match! %d",(ulong)uVar6);
    break;
  case kInstNop:
    uVar6 = out(in_RSI);
    StringPrintf_abi_cxx11_((char *)in_RDI,"nop -> %d",(ulong)uVar6);
    break;
  case kInstFail:
    StringPrintf_abi_cxx11_((char *)in_RDI,"fail");
    break;
  default:
    IVar3 = opcode(in_RSI);
    StringPrintf_abi_cxx11_((char *)in_RDI,"opcode %d",(ulong)IVar3);
  }
  return in_RDI;
}

Assistant:

std::string Prog::Inst::Dump() {
  switch (opcode()) {
    default:
      return StringPrintf("opcode %d", static_cast<int>(opcode()));

    case kInstAlt:
      return StringPrintf("alt -> %d | %d", out(), out1_);

    case kInstAltMatch:
      return StringPrintf("altmatch -> %d | %d", out(), out1_);

    case kInstByteRange:
      return StringPrintf("byte%s [%02x-%02x] %d -> %d",
                          foldcase() ? "/i" : "",
                          lo_, hi_, hint(), out());

    case kInstCapture:
      return StringPrintf("capture %d -> %d", cap_, out());

    case kInstEmptyWidth:
      return StringPrintf("emptywidth %#x -> %d",
                          static_cast<int>(empty_), out());

    case kInstMatch:
      return StringPrintf("match! %d", match_id());

    case kInstNop:
      return StringPrintf("nop -> %d", out());

    case kInstFail:
      return StringPrintf("fail");
  }
}